

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  cmTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  undefined4 extraout_var;
  char *value;
  string msg;
  allocator<char> local_d1;
  undefined1 local_d0 [192];
  
  TVar3 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar3) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName)
    ;
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    bVar2 = DetermineIfIntegrityApp(this);
    if (bVar2) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"add_library(<name> SHARED ...) not supported: ",&local_d1);
    std::__cxx11::string::append((string *)local_d0);
    cmSystemTools::Message((string *)local_d0,(char *)0x0);
    goto LAB_001e4826;
  case MODULE_LIBRARY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"add_library(<name> MODULE ...) not supported: ",&local_d1);
    std::__cxx11::string::append((string *)local_d0);
    cmSystemTools::Message((string *)local_d0,(char *)0x0);
LAB_001e4826:
    std::__cxx11::string::~string((string *)local_d0);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    goto LAB_001e48cb;
  case GLOBAL_TARGET:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    iVar4 = (*((this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator)->
              _vptr_cmGlobalGenerator[0x18])();
    bVar2 = std::operator==(&this->TargetNameReal,(char *)CONCAT44(extraout_var,iVar4));
    if (!bVar2) {
      return;
    }
LAB_001e48cb:
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_001e4729_default;
  }
  pcVar1 = this->GeneratorTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"GENERATOR_FILE_NAME",&local_d1);
  cmTarget::SetProperty(pcVar1,(string *)local_d0,(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_d0);
  pcVar1 = this->GeneratorTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"GENERATOR_FILE_NAME_EXT",&local_d1);
  value = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar1,(string *)local_d0,value);
  std::__cxx11::string::~string((string *)local_d0);
  GenerateTarget(this);
switchD_001e4729_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg = "add_library(<name> SHARED ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg = "add_library(<name> MODULE ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME",
                                             this->Name.c_str());
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  this->GenerateTarget();
}